

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<float> * __thiscall Imath_3_2::Matrix44<float>::transposed(Matrix44<float> *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Matrix44<float> *in_RDI;
  
  fVar1 = this->x[1][0];
  fVar2 = this->x[2][0];
  fVar3 = this->x[3][0];
  fVar4 = this->x[0][1];
  fVar5 = this->x[1][1];
  fVar6 = this->x[2][1];
  fVar7 = this->x[3][1];
  fVar8 = this->x[0][2];
  fVar9 = this->x[1][2];
  fVar10 = this->x[2][2];
  fVar11 = this->x[3][2];
  fVar12 = this->x[0][3];
  fVar13 = this->x[1][3];
  fVar14 = this->x[2][3];
  fVar15 = this->x[3][3];
  in_RDI->x[0][0] = this->x[0][0];
  in_RDI->x[0][1] = fVar1;
  in_RDI->x[0][2] = fVar2;
  in_RDI->x[0][3] = fVar3;
  in_RDI->x[1][0] = fVar4;
  in_RDI->x[1][1] = fVar5;
  in_RDI->x[1][2] = fVar6;
  in_RDI->x[1][3] = fVar7;
  in_RDI->x[2][0] = fVar8;
  in_RDI->x[2][1] = fVar9;
  in_RDI->x[2][2] = fVar10;
  in_RDI->x[2][3] = fVar11;
  in_RDI->x[3][0] = fVar12;
  in_RDI->x[3][1] = fVar13;
  in_RDI->x[3][2] = fVar14;
  in_RDI->x[3][3] = fVar15;
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline Matrix44<T>
Matrix44<T>::transposed () const IMATH_NOEXCEPT
{
    return Matrix44 (
        x[0][0],
        x[1][0],
        x[2][0],
        x[3][0],
        x[0][1],
        x[1][1],
        x[2][1],
        x[3][1],
        x[0][2],
        x[1][2],
        x[2][2],
        x[3][2],
        x[0][3],
        x[1][3],
        x[2][3],
        x[3][3]);
}